

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debuginfo.cpp
# Opt level: O1

void wasm::debuginfo::copyBetweenFunctions
               (Expression *origin,Expression *copy,Function *originFunc,Function *copyFunc)

{
  undefined1 auStack_238 [8];
  Lister copyList;
  Lister originList;
  optional<wasm::Function::DebugLocation> location;
  Expression *origin_local;
  Expression *copy_local;
  
  if ((originFunc->debugLocations)._M_h._M_element_count != 0) {
    copyList.list.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    location.super__Optional_base<wasm::Function::DebugLocation,_true,_true>._M_payload.
    super__Optional_payload_base<wasm::Function::DebugLocation>._16_8_ = origin;
    origin_local = copy;
    Walker<Lister,_wasm::UnifiedExpressionVisitor<Lister,_void>_>::walk
              ((Walker<Lister,_wasm::UnifiedExpressionVisitor<Lister,_void>_> *)
               &copyList.list.
                super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,
               (Expression **)
               ((long)&location.super__Optional_base<wasm::Function::DebugLocation,_true,_true>.
                       _M_payload.super__Optional_payload_base<wasm::Function::DebugLocation>.
                       _M_payload._M_value.symbolNameIndex.
                       super__Optional_base<unsigned_int,_true,_true> + 4));
    auStack_238 = (undefined1  [8])0x0;
    copyList.super_PostWalker<Lister,_wasm::UnifiedExpressionVisitor<Lister,_void>_>.
    super_Walker<Lister,_wasm::UnifiedExpressionVisitor<Lister,_void>_>.replacep =
         (Expression **)0x0;
    copyList.super_PostWalker<Lister,_wasm::UnifiedExpressionVisitor<Lister,_void>_>.
    super_Walker<Lister,_wasm::UnifiedExpressionVisitor<Lister,_void>_>.stack.fixed._M_elems[9].
    currp = (Expression **)0x0;
    copyList.super_PostWalker<Lister,_wasm::UnifiedExpressionVisitor<Lister,_void>_>.
    super_Walker<Lister,_wasm::UnifiedExpressionVisitor<Lister,_void>_>.stack.flexible.
    super__Vector_base<wasm::Walker<Lister,_wasm::UnifiedExpressionVisitor<Lister,_void>_>::Task,_std::allocator<wasm::Walker<Lister,_wasm::UnifiedExpressionVisitor<Lister,_void>_>::Task>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    copyList.super_PostWalker<Lister,_wasm::UnifiedExpressionVisitor<Lister,_void>_>.
    super_Walker<Lister,_wasm::UnifiedExpressionVisitor<Lister,_void>_>.stack.flexible.
    super__Vector_base<wasm::Walker<Lister,_wasm::UnifiedExpressionVisitor<Lister,_void>_>::Task,_std::allocator<wasm::Walker<Lister,_wasm::UnifiedExpressionVisitor<Lister,_void>_>::Task>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    copyList.super_PostWalker<Lister,_wasm::UnifiedExpressionVisitor<Lister,_void>_>.
    super_Walker<Lister,_wasm::UnifiedExpressionVisitor<Lister,_void>_>.stack.flexible.
    super__Vector_base<wasm::Walker<Lister,_wasm::UnifiedExpressionVisitor<Lister,_void>_>::Task,_std::allocator<wasm::Walker<Lister,_wasm::UnifiedExpressionVisitor<Lister,_void>_>::Task>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    copyList.super_PostWalker<Lister,_wasm::UnifiedExpressionVisitor<Lister,_void>_>.
    super_Walker<Lister,_wasm::UnifiedExpressionVisitor<Lister,_void>_>.currFunction =
         (Function *)0x0;
    copyList.super_PostWalker<Lister,_wasm::UnifiedExpressionVisitor<Lister,_void>_>.
    super_Walker<Lister,_wasm::UnifiedExpressionVisitor<Lister,_void>_>.currModule = (Module *)0x0;
    copyList.list.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    copyList.list.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    Walker<Lister,_wasm::UnifiedExpressionVisitor<Lister,_void>_>::walk
              ((Walker<Lister,_wasm::UnifiedExpressionVisitor<Lister,_void>_> *)auStack_238,
               &origin_local);
    if ((Module *)
        copyList.list.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
        _M_impl.super__Vector_impl_data._M_start !=
        copyList.super_PostWalker<Lister,_wasm::UnifiedExpressionVisitor<Lister,_void>_>.
        super_Walker<Lister,_wasm::UnifiedExpressionVisitor<Lister,_void>_>.currModule) {
      __assert_fail("originList.list.size() == copyList.list.size()",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/ir/debuginfo.cpp"
                    ,0x2c,
                    "void wasm::debuginfo::copyBetweenFunctions(Expression *, Expression *, Function *, Function *)"
                   );
    }
    if (copyList.super_PostWalker<Lister,_wasm::UnifiedExpressionVisitor<Lister,_void>_>.
        super_Walker<Lister,_wasm::UnifiedExpressionVisitor<Lister,_void>_>.currModule !=
        (Module *)0x0) {
      operator_delete(copyList.
                      super_PostWalker<Lister,_wasm::UnifiedExpressionVisitor<Lister,_void>_>.
                      super_Walker<Lister,_wasm::UnifiedExpressionVisitor<Lister,_void>_>.currModule
                      ,(long)copyList.list.
                             super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                       (long)copyList.
                             super_PostWalker<Lister,_wasm::UnifiedExpressionVisitor<Lister,_void>_>
                             .super_Walker<Lister,_wasm::UnifiedExpressionVisitor<Lister,_void>_>.
                             currModule);
    }
    if (copyList.super_PostWalker<Lister,_wasm::UnifiedExpressionVisitor<Lister,_void>_>.
        super_Walker<Lister,_wasm::UnifiedExpressionVisitor<Lister,_void>_>.stack.fixed._M_elems[9].
        currp != (Expression **)0x0) {
      operator_delete(copyList.
                      super_PostWalker<Lister,_wasm::UnifiedExpressionVisitor<Lister,_void>_>.
                      super_Walker<Lister,_wasm::UnifiedExpressionVisitor<Lister,_void>_>.stack.
                      fixed._M_elems[9].currp,
                      (long)copyList.
                            super_PostWalker<Lister,_wasm::UnifiedExpressionVisitor<Lister,_void>_>.
                            super_Walker<Lister,_wasm::UnifiedExpressionVisitor<Lister,_void>_>.
                            stack.flexible.
                            super__Vector_base<wasm::Walker<Lister,_wasm::UnifiedExpressionVisitor<Lister,_void>_>::Task,_std::allocator<wasm::Walker<Lister,_wasm::UnifiedExpressionVisitor<Lister,_void>_>::Task>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)copyList.
                            super_PostWalker<Lister,_wasm::UnifiedExpressionVisitor<Lister,_void>_>.
                            super_Walker<Lister,_wasm::UnifiedExpressionVisitor<Lister,_void>_>.
                            stack.fixed._M_elems[9].currp);
    }
  }
  return;
}

Assistant:

void copyBetweenFunctions(Expression* origin,
                          Expression* copy,
                          Function* originFunc,
                          Function* copyFunc) {
  if (originFunc->debugLocations.empty()) {
    return; // No debug info to copy
  }

  struct Lister : public PostWalker<Lister, UnifiedExpressionVisitor<Lister>> {
    std::vector<Expression*> list;
    void visitExpression(Expression* curr) { list.push_back(curr); }
  };

  Lister originList;
  originList.walk(origin);
  Lister copyList;
  copyList.walk(copy);

  auto& originDebug = originFunc->debugLocations;
  auto& copyDebug = copyFunc->debugLocations;

  assert(originList.list.size() == copyList.list.size());
  for (Index i = 0; i < originList.list.size(); i++) {
    auto iter = originDebug.find(originList.list[i]);
    if (iter != originDebug.end()) {
      auto location = iter->second;
      copyDebug[copyList.list[i]] = location;
    }
  }
}